

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapedLattice.cpp
# Opt level: O1

void __thiscall OpenMD::shapedLattice::findSites(shapedLattice *this)

{
  uint uVar1;
  pointer pVVar2;
  bool bVar3;
  int nx;
  int ny;
  int iVar4;
  uint nz;
  long lVar5;
  long lVar6;
  ulong uVar7;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> latticePos;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> pointsOrt;
  Vector3d myOrt;
  Vector3d myPoint;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_d8;
  ulong local_b8;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *local_b0;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *local_a8;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_a0;
  Vector3<double> local_88;
  Vector3<double> local_68;
  Vector3<double> local_48;
  
  pVVar2 = (this->sites_).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->sites_).
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_finish != pVVar2) {
    (this->sites_).
    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar2;
  }
  pVVar2 = (this->orientations_).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->orientations_).
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_finish != pVVar2) {
    (this->orientations_).
    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar2;
  }
  local_d8.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            (&local_a0,&this->simpleLattice_->cellSitesOrt);
  if (this->beginNx_ <= this->endNx_) {
    local_a8 = &this->sites_;
    local_b0 = &this->orientations_;
    uVar1 = this->simpleLattice_->nCellSites;
    nx = this->beginNx_;
    do {
      ny = this->beginNy_;
      if (this->beginNy_ <= this->endNy_) {
        do {
          nz = this->beginNz_;
          if ((int)nz <= this->endNz_) {
            do {
              Lattice::getLatticePointsPos(this->simpleLattice_,&local_d8,nx,ny,nz);
              local_b8 = (ulong)nz;
              if (0 < (int)uVar1) {
                lVar6 = 0;
                uVar7 = 0;
                do {
                  local_48.super_Vector<double,_3U>.data_[0] = 0.0;
                  local_48.super_Vector<double,_3U>.data_[1] = 0.0;
                  local_48.super_Vector<double,_3U>.data_[2] = 0.0;
                  if (&local_48 !=
                      local_d8.
                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar7) {
                    lVar5 = 0;
                    do {
                      local_48.super_Vector<double,_3U>.data_[lVar5] =
                           *(double *)
                            ((long)((local_d8.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super_Vector<double,_3U>).data_ + lVar5 * 8 + lVar6);
                      lVar5 = lVar5 + 1;
                    } while (lVar5 != 3);
                  }
                  iVar4 = (*this->_vptr_shapedLattice[2])(this,&local_48);
                  if ((char)iVar4 != '\0') {
                    local_68.super_Vector<double,_3U>.data_[0] = 0.0;
                    local_68.super_Vector<double,_3U>.data_[1] = 0.0;
                    local_68.super_Vector<double,_3U>.data_[2] = 0.0;
                    if (&local_68 !=
                        local_d8.
                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar7) {
                      lVar5 = 0;
                      do {
                        local_68.super_Vector<double,_3U>.data_[lVar5] =
                             *(double *)
                              ((long)((local_d8.
                                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super_Vector<double,_3U>).data_ + lVar5 * 8 + lVar6);
                        lVar5 = lVar5 + 1;
                      } while (lVar5 != 3);
                    }
                    local_88.super_Vector<double,_3U>.data_[0] = 0.0;
                    local_88.super_Vector<double,_3U>.data_[1] = 0.0;
                    local_88.super_Vector<double,_3U>.data_[2] = 0.0;
                    if (&local_88 !=
                        local_a0.
                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar7) {
                      lVar5 = 0;
                      do {
                        local_88.super_Vector<double,_3U>.data_[lVar5] =
                             *(double *)
                              ((long)((local_a0.
                                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super_Vector<double,_3U>).data_ + lVar5 * 8 + lVar6);
                        lVar5 = lVar5 + 1;
                      } while (lVar5 != 3);
                    }
                    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                    ::push_back(local_a8,&local_68);
                    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                    ::push_back(local_b0,&local_88);
                  }
                  uVar7 = uVar7 + 1;
                  lVar6 = lVar6 + 0x18;
                } while (uVar7 != uVar1);
              }
              nz = (int)local_b8 + 1;
            } while ((int)local_b8 < this->endNz_);
          }
          bVar3 = ny < this->endNy_;
          ny = ny + 1;
        } while (bVar3);
      }
      bVar3 = nx < this->endNx_;
      nx = nx + 1;
    } while (bVar3);
  }
  this->sitesComputed_ = true;
  if (local_a0.
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.
                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a0.
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void shapedLattice::findSites() {
    sites_.clear();
    orientations_.clear();

    std::vector<Vector3d> latticePos;
    std::vector<Vector3d> pointsOrt = simpleLattice_->getLatticePointsOrt();
    int numMolPerCell               = simpleLattice_->getNumSitesPerCell();

    for (int i = beginNx_; i <= endNx_; i++) {
      for (int j = beginNy_; j <= endNy_; j++) {
        for (int k = beginNz_; k <= endNz_; k++) {
          // get the position of the cell sites
          simpleLattice_->getLatticePointsPos(latticePos, i, j, k);
          for (int l = 0; l < numMolPerCell; l++) {
            if (isInterior(latticePos[l])) {
              Vector3d myPoint = latticePos[l];
              Vector3d myOrt   = pointsOrt[l];
              sites_.push_back(myPoint);
              orientations_.push_back(myOrt);
            }
          }
        }
      }
    }
    sitesComputed_ = true;
  }